

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O1

bool __thiscall
ON_Triangle::GetBarycentricCoordinates
          (ON_Triangle *this,ON_3dPoint *P,bool constrainInside,double *s1,double *s2)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ON_3dPoint from_pt;
  ON_3dPoint from_pt_00;
  ON_3dPoint to_pt;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  double *pdVar16;
  double *y;
  ulong uVar17;
  int i_00;
  uint uVar18;
  ON_3dPoint *pOVar19;
  int i;
  ulong uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  ON_3dPoint s;
  double t;
  ON_3dVector V_1;
  ON_3dVector W;
  ON_3dVector V;
  ON_3dVector VP;
  double local_118;
  double local_110;
  ON_3dPoint local_e8;
  ON_3dPoint *local_c8;
  ON_3dVector local_c0;
  ON_Line local_a8;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  uVar21 = 0xffffffff;
  uVar22 = 0x7fefffff;
  uVar20 = 0;
  uVar17 = 0;
  pOVar19 = this->m_V;
  do {
    ON_3dPoint::operator-((ON_3dVector *)&local_a8,P,pOVar19);
    dVar23 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&local_a8);
    if (dVar23 < (double)CONCAT44(uVar22,uVar21)) {
      uVar17 = uVar20 & 0xffffffff;
      uVar22 = (int)((ulong)dVar23 >> 0x20);
      uVar21 = SUB84(dVar23,0);
    }
    uVar20 = uVar20 + 1;
    pOVar19 = pOVar19 + 1;
  } while (uVar20 != 3);
  i_00 = (int)uVar17;
  pOVar19 = this->m_V + i_00;
  local_c8 = P;
  ON_3dPoint::operator-(&local_48,P,pOVar19);
  iVar13 = ((i_00 + 1) / 3) * -3 + i_00 + 1;
  ON_3dPoint::operator-(&local_60,this->m_V + iVar13,pOVar19);
  iVar14 = ((i_00 + 2) / 3) * -3 + i_00 + 2;
  ON_3dPoint::operator-(&local_78,this->m_V + iVar14,pOVar19);
  ON_3dPoint::ON_3dPoint(&local_e8,0.0,0.0,0.0);
  pdVar16 = ON_3dPoint::operator[](&local_e8,iVar13);
  y = ON_3dPoint::operator[](&local_e8,iVar14);
  iVar15 = ON_DecomposeVector(&local_48,&local_60,&local_78,pdVar16,y);
  if (iVar15 == 0) {
    ON_Line::ON_Line(&local_a8,this->m_V[1],this->m_V[2]);
    ON_Line::Direction(&local_c0,&local_a8);
    local_118 = ON_3dVector::LengthSquared(&local_c0);
    ON_Line::~ON_Line(&local_a8);
    pOVar19 = this[1].m_V;
    uVar18 = 2;
    uVar17 = 3;
    iVar13 = 0;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar17;
      uVar20 = (ulong)uVar18;
      if (uVar18 == 3) {
        uVar20 = 0;
      }
      uVar5 = this->m_V[uVar20].x;
      uVar6 = this->m_V[uVar20].y;
      from_pt.y = (double)uVar6;
      from_pt.x = (double)uVar5;
      from_pt.z = this->m_V[uVar20].z;
      ON_Line::ON_Line(&local_a8,from_pt,
                       *(ON_3dPoint *)
                        ((long)pOVar19 +
                        (SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe) *
                        -0x24));
      ON_Line::Direction(&local_c0,&local_a8);
      dVar23 = ON_3dVector::LengthSquared(&local_c0);
      iVar14 = uVar18 - 1;
      ON_Line::~ON_Line(&local_a8);
      if (dVar23 <= local_118) {
        dVar23 = local_118;
        iVar14 = iVar13;
      }
      uVar18 = uVar18 + 1;
      pOVar19 = pOVar19 + 1;
      uVar17 = uVar17 + 1;
      local_118 = dVar23;
      iVar13 = iVar14;
    } while (uVar18 != 4);
    iVar13 = iVar14 + ((iVar14 + 1) / 3) * -3 + 1;
    iVar14 = iVar14 + ((iVar14 + 2) / 3) * -3 + 2;
    uVar9 = this->m_V[iVar14].x;
    uVar10 = this->m_V[iVar14].y;
    to_pt.y = (double)uVar10;
    to_pt.x = (double)uVar9;
    uVar7 = this->m_V[iVar13].x;
    uVar8 = this->m_V[iVar13].y;
    from_pt_00.y = (double)uVar8;
    from_pt_00.x = (double)uVar7;
    from_pt_00.z = this->m_V[iVar13].z;
    to_pt.z = this->m_V[iVar14].z;
    ON_Line::ON_Line(&local_a8,from_pt_00,to_pt);
    bVar11 = ON_Line::ClosestPointTo(&local_a8,local_c8,&local_c0.x);
    ON_Line::~ON_Line(&local_a8);
    if (bVar11) {
      dVar23 = 1.0 - local_c0.x;
      pdVar16 = ON_3dPoint::operator[](&local_e8,iVar13);
      *pdVar16 = dVar23;
      pdVar16 = ON_3dPoint::operator[](&local_e8,iVar14);
      uVar22 = SUB84(local_c0.x,0);
      uVar21 = (undefined4)((ulong)local_c0.x >> 0x20);
LAB_004ce22e:
      *pdVar16 = (double)CONCAT44(uVar21,uVar22);
    }
  }
  else {
    pdVar16 = ON_3dPoint::operator[](&local_e8,iVar13);
    local_110 = 1.0;
    dVar23 = *pdVar16;
    pdVar16 = ON_3dPoint::operator[](&local_e8,iVar14);
    dVar1 = *pdVar16;
    pdVar16 = ON_3dPoint::operator[](&local_e8,i_00);
    *pdVar16 = (1.0 - dVar23) - dVar1;
    bVar11 = true;
    if (constrainInside) {
      pOVar19 = this->m_V + 2;
      uVar20 = 2;
      uVar17 = 1;
      do {
        this = (ON_Triangle *)((long)this + 0x18);
        iVar13 = (int)uVar20;
        pdVar16 = ON_3dPoint::operator[](&local_e8,iVar13 + -2);
        if (*pdVar16 <= 0.0 && *pdVar16 != 0.0) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar17;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar20;
          ON_Line::ON_Line(&local_a8,
                           *(ON_3dPoint *)
                            ((long)this +
                            (SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe) *
                            -0x24),*(ON_3dPoint *)
                                    ((long)pOVar19 +
                                    (SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) &
                                    0x3ffffffffffffffe) * -0x24));
          bVar12 = ON_Line::ClosestPointTo(&local_a8,local_c8,&local_c0.x);
          ON_Line::~ON_Line(&local_a8);
          if (bVar12) {
            ON_3dPoint::ON_3dPoint(&local_a8.from,0.0,0.0,0.0);
            local_e8.z = local_a8.from.z;
            local_e8.x = local_a8.from.x;
            local_e8.y = local_a8.from.y;
            if (0.0 <= local_c0.x) {
              if (1.0 <= local_c0.x) {
                local_110 = 1.0;
              }
              else {
                dVar23 = 1.0 - local_c0.x;
                pdVar16 = ON_3dPoint::operator[]
                                    (&local_e8,~((int)((uVar17 & 0xffffffff) / 3) * 3) + iVar13);
                *pdVar16 = dVar23;
                local_110 = local_c0.x;
              }
            }
            else {
              uVar20 = (ulong)(iVar13 - 1);
            }
            pdVar16 = ON_3dPoint::operator[]
                                (&local_e8,(int)uVar20 + (int)((uVar20 & 0xffffffff) / 3) * -3);
            uVar22 = SUB84(local_110,0);
            uVar21 = (undefined4)((ulong)local_110 >> 0x20);
            goto LAB_004ce22e;
          }
          break;
        }
        uVar20 = uVar20 + 1;
        pOVar19 = pOVar19 + 1;
        uVar17 = uVar17 + 1;
      } while ((int)uVar20 != 5);
    }
  }
  if (s1 != (double *)0x0) {
    pdVar16 = ON_3dPoint::operator[](&local_e8,1);
    *s1 = *pdVar16;
  }
  if (s2 != (double *)0x0) {
    pdVar16 = ON_3dPoint::operator[](&local_e8,2);
    *s2 = *pdVar16;
  }
  return bVar11;
}

Assistant:

bool ON_Triangle::GetBarycentricCoordinates(
  const ON_3dPoint& P,
  bool constrainInside,
  double* s1, double* s2
) const
{
	bool rc = false;
	// Choose  base vertex v[i0] is closest to P
	int i0 = 0;
	double Min_norm = ON_DBL_MAX;
	for (int i = 0; i < 3; i++)
	{
		ON_3dVector V = P - m_V[i];
		double d = V.MaximumCoordinate();
		if (d < Min_norm)
		{
			i0 = i;
			Min_norm = d;
		}
	}

	ON_3dVector VP = P - m_V[i0];
	ON_3dVector V = m_V[(i0 + 1) % 3] - m_V[i0];
	ON_3dVector W = m_V[(i0 + 2) % 3] - m_V[i0];
	ON_3dPoint s(0, 0, 0);		// set to barycentric coordinates of solution

	if (ON_DecomposeVector(VP, V, W, &s[(i0 + 1) % 3], &s[(i0 + 2) % 3]))
	{
		// use decomposition
		s[i0] = 1 - s[(i0 + 1) % 3] - s[(i0 + 2) % 3];

    if (constrainInside)
		  for (int i = 0; i < 3; i++)
			  if (s[i] < 0)
			  {
				  double t;
				  if (Edge(i).ClosestPointTo(P, &t))	
				  {
					  s = ON_3dPoint( 0,0,0 );
					  if (t < 0)
					  {
						  s[(i + 1) % 3] = 1.0;
					  }

					  else if (t >= 1.0)
					  {
						  s[(i + 2) % 3] = 1.0;
					  }
					  else
					  {
						  s[(i + 1) % 3] = 1 - t;
						  s[(i + 2) % 3] = t;
					  }
				  }
				  break;
			  }
		rc = true;
	}
	else
	{
		// decomposition failed:
		// Find closest point to longest edge i0
		double max = Edge(0).Direction().LengthSquared();
    i0 = 0;
		for (int i = 1; i < 3; i++)
		{
			double lensq = Edge(i).Direction().LengthSquared();
			if (max < lensq)
			{
				i0 = i;
				max = lensq;
			}
		}
		double t;
		if (Edge(i0).ClosestPointTo(P, &t))
		{
			s[(i0 + 1) % 3] = (1 - t);
			s[(i0 + 2) % 3] = t;
			rc = true;
		}
	
	}
	if (s1)
		*s1 = s[1];
	if (s2)
		*s2 = s[2];
	return rc;
}